

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int parse_range_dec64(char **str_num,uint8_t dig,int64_t *num)

{
  char cVar1;
  char cVar2;
  uint8_t exp;
  int iVar3;
  ushort **ppuVar4;
  int64_t iVar5;
  long lVar6;
  long lVar7;
  char cVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  uint8_t uVar12;
  char cVar13;
  int iVar14;
  
  uVar11 = (uint)dig;
  cVar1 = **str_num;
  pcVar10 = *str_num + ((cVar1 - 0x2bU & 0xfd) == 0);
  ppuVar4 = __ctype_b_loc();
  iVar14 = 1;
  if ((*(byte *)((long)*ppuVar4 + (long)*pcVar10 * 2 + 1) & 8) != 0) {
    cVar8 = -1;
    lVar6 = 0;
    cVar13 = '\0';
    exp = '\0';
    while( true ) {
      cVar2 = *pcVar10;
      if (((*(byte *)((long)*ppuVar4 + (long)cVar2 * 2 + 1) & 8) == 0) &&
         ((cVar2 != '.' || (-1 < cVar8)))) break;
      if ('\x12' < cVar13) {
        return 1;
      }
      if (cVar2 == '.') {
        if (pcVar10[1] == '.') break;
        cVar8 = cVar8 + '\x01';
      }
      else {
        uVar12 = exp + '\x01';
        if (cVar2 != '0') {
          uVar12 = '\0';
        }
        lVar6 = (long)cVar2 + lVar6 * 10 + -0x30;
        if (-1 < cVar8) {
          exp = uVar12;
        }
        cVar8 = cVar8 + (-1 < cVar8);
        cVar13 = cVar13 + '\x01';
      }
      pcVar10 = pcVar10 + 1;
    }
    if (cVar8 != '\0') {
      if (cVar8 == -1) {
        cVar8 = '\0';
      }
      if (exp != '\0') {
        cVar8 = cVar8 - exp;
        cVar13 = cVar13 - exp;
        iVar5 = dec_pow(exp);
        lVar6 = lVar6 / iVar5;
      }
      iVar9 = (int)cVar8;
      iVar3 = uVar11 - iVar9;
      if (iVar3 != 0 && iVar9 <= (int)uVar11) {
        if (0x12 < cVar13 + iVar3 + -1) {
          return 1;
        }
        iVar5 = dec_pow((uint8_t)iVar3);
        lVar6 = lVar6 * iVar5;
      }
      if (iVar9 <= (int)uVar11) {
        lVar7 = -lVar6;
        if (cVar1 != '-') {
          lVar7 = lVar6;
        }
        *str_num = pcVar10;
        *num = lVar7;
        iVar14 = 0;
      }
    }
  }
  return iVar14;
}

Assistant:

int
parse_range_dec64(const char **str_num, uint8_t dig, int64_t *num)
{
    const char *ptr;
    int minus = 0;
    int64_t ret = 0;
    int8_t str_exp, str_dig = -1, trailing_zeros = 0;

    ptr = *str_num;

    if (ptr[0] == '-') {
        minus = 1;
        ++ptr;
    } else if (ptr[0] == '+') {
        ++ptr;
    }

    if (!isdigit(ptr[0])) {
        /* there must be at least one */
        return 1;
    }

    for (str_exp = 0; isdigit(ptr[0]) || ((ptr[0] == '.') && (str_dig < 0)); ++ptr) {
        if (str_exp > 18) {
            return 1;
        }

        if (ptr[0] == '.') {
            if (ptr[1] == '.') {
                /* it's the next interval */
                break;
            }
            ++str_dig;
        } else {
            ret = ret * 10 + (ptr[0] - '0');
            if (str_dig > -1) {
                ++str_dig;
                if (ptr[0] == '0') {
                    /* possibly trailing zero */
                    trailing_zeros++;
                } else {
                    trailing_zeros = 0;
                }
            }
            ++str_exp;
        }
    }
    if (str_dig == 0) {
        /* no digits after '.' */
        return 1;
    } else if (str_dig == -1) {
        /* there are 0 numbers after the floating point */
        str_dig = 0;
    }
    /* remove trailing zeros */
    if (trailing_zeros) {
        str_dig -= trailing_zeros;
        str_exp -= trailing_zeros;
        ret = ret / dec_pow(trailing_zeros);
    }

    /* it's parsed, now adjust the number based on fraction-digits, if needed */
    if (str_dig < dig) {
        if ((str_exp - 1) + (dig - str_dig) > 18) {
            return 1;
        }
        ret *= dec_pow(dig - str_dig);
    }
    if (str_dig > dig) {
        return 1;
    }

    if (minus) {
        ret *= -1;
    }
    *str_num = ptr;
    *num = ret;

    return 0;
}